

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.cpp
# Opt level: O2

string * __thiscall
ser::MetainfoSet::ToString_abi_cxx11_(string *__return_storage_ptr__,MetainfoSet *this)

{
  _Rb_tree_node_base *this_00;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  any *operand;
  char *pcVar6;
  type_info *this_01;
  float fVar7;
  double dVar8;
  ostringstream ss_1;
  ostringstream ss;
  string local_360 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  ostringstream local_320 [376];
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"[ ");
  for (p_Var5 = (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(this->data_)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    poVar3 = std::operator<<((ostream *)local_1a8,(string *)(p_Var5 + 1));
    poVar3 = std::operator<<(poVar3,"=");
    this_01 = (type_info *)&void::typeinfo;
    if (*(long **)(p_Var5 + 2) != (long *)0x0) {
      this_01 = (type_info *)(**(code **)(**(long **)(p_Var5 + 2) + 0x10))();
    }
    std::__cxx11::ostringstream::ostringstream(local_320);
    this_00 = p_Var5 + 2;
    bVar1 = std::type_info::operator==(this_01,(type_info *)&bool::typeinfo);
    if (bVar1) {
      bVar1 = boost::any_cast<bool>((any *)this_00);
      pcVar6 = "false";
      if (bVar1) {
        pcVar6 = "true";
      }
      std::operator<<((ostream *)local_320,pcVar6);
    }
    else {
      bVar1 = std::type_info::operator==(this_01,(type_info *)&int::typeinfo);
      if (bVar1) {
        iVar2 = boost::any_cast<int>((any *)this_00);
        std::ostream::operator<<(local_320,iVar2);
      }
      else {
        bVar1 = std::type_info::operator==(this_01,(type_info *)&float::typeinfo);
        if (bVar1) {
          fVar7 = boost::any_cast<float>((any *)this_00);
          std::ostream::operator<<(local_320,fVar7);
        }
        else {
          bVar1 = std::type_info::operator==(this_01,(type_info *)&double::typeinfo);
          if (bVar1) {
            dVar8 = boost::any_cast<double>((any *)this_00);
            std::ostream::_M_insert<double>(dVar8);
          }
          else {
            bVar1 = std::type_info::operator==(this_01,(type_info *)&std::__cxx11::string::typeinfo)
            ;
            if (bVar1) {
              poVar4 = std::operator<<((ostream *)local_320,"\"");
              boost::any_cast<std::__cxx11::string>(&local_340,(boost *)this_00,operand);
              poVar4 = std::operator<<(poVar4,(string *)&local_340);
              std::operator<<(poVar4,"\"");
              std::__cxx11::string::~string((string *)&local_340);
            }
          }
        }
      }
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_320);
    poVar3 = std::operator<<(poVar3,local_360);
    std::operator<<(poVar3," ");
    std::__cxx11::string::~string(local_360);
  }
  std::operator<<((ostream *)local_1a8,"]");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string MetainfoSet::ToString() const
{
    std::ostringstream ss;
    ss << "[ ";

    for (std::map<std::string, boost::any>::const_iterator iter = data_.begin(); iter != data_.end(); ++iter)
    {
        ss << iter->first << "=" << writeAny(iter->second) << " ";
    }

    ss << "]";
    return ss.str();
}